

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_SEL(DisasContext_conflict1 *s,arg_rrr *a)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  ulong uVar2;
  TCGTemp *ret;
  TCGTemp *pTVar3;
  uintptr_t o;
  TCGv_i32 var;
  TCGTemp *ts;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar2 = s->features & 8;
  }
  else {
    uVar2 = s->features >> 0x22 & 1;
  }
  if (uVar2 != 0) {
    iVar1 = a->rn;
    ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    load_reg_var(s,(TCGv_i32)((long)ret - (long)s_00),iVar1);
    iVar1 = a->rm;
    s_01 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar3 - (long)s_01);
    load_reg_var(s,var,iVar1);
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)pTVar3,(TCGArg)(s_00->cpu_env + (long)s_00),
                        0x21c);
    ts = (TCGTemp *)(var + (long)s_00);
    local_48 = pTVar3;
    local_40 = ret;
    local_38 = ts;
    tcg_gen_callN_aarch64(s_00,helper_sel_flags_aarch64,ret,3,&local_48);
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
    tcg_temp_free_internal_aarch64(s_00,ts);
    store_reg(s,a->rd,(TCGv_i32)((long)ret - (long)s_00));
  }
  return uVar2 != 0;
}

Assistant:

static bool trans_SEL(DisasContext *s, arg_rrr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2, t3;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    t3 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, t3, tcg_ctx->cpu_env, offsetof(CPUARMState, GE));
    gen_helper_sel_flags(tcg_ctx, t1, t3, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}